

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralString.cpp
# Opt level: O0

LiteralString * Js::LiteralString::CreateEmptyString(StaticType *type)

{
  ScriptContext *this;
  Recycler *pRVar1;
  LiteralString *this_00;
  TrackAllocData local_38;
  StaticType *local_10;
  StaticType *type_local;
  
  local_10 = type;
  this = Js::Type::GetScriptContext(&type->super_Type);
  pRVar1 = ScriptContext::GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LiteralString.cpp"
             ,0x29);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_38);
  this_00 = (LiteralString *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  LiteralString(this_00,local_10,L"",0);
  return this_00;
}

Assistant:

LiteralString* LiteralString::CreateEmptyString(StaticType* type)
    {
        return RecyclerNew(type->GetScriptContext()->GetRecycler(), LiteralString, type, _u(""), 0);
    }